

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLNodePrivate::SetTagName(ON_XMLNodePrivate *this,wchar_t *name)

{
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lg;
  wchar_t *name_local;
  ON_XMLNodePrivate *this_local;
  
  lg._M_device = (mutex_type *)name;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,&this->m_mutex);
  ON_wString::operator=(&this->m_name,(wchar_t *)lg._M_device);
  ON_wString::TrimLeft(&this->m_name,(wchar_t *)0x0);
  ON_wString::TrimRight(&this->m_name,(wchar_t *)0x0);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void ON_XMLNodePrivate::SetTagName(const wchar_t* name)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  m_name = name;
  m_name.TrimLeft();
  m_name.TrimRight();
}